

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O0

opj_image_t * upsample_image_components(opj_image_t *original)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  void *__ptr;
  undefined4 *puVar4;
  opj_image_comp_t *poVar5;
  opj_image_comp_t *poVar6;
  uint local_88;
  uint local_84;
  OPJ_UINT32 dx_1;
  OPJ_UINT32 xorg_1;
  OPJ_UINT32 x_1;
  OPJ_UINT32 dx;
  OPJ_UINT32 xorg;
  OPJ_UINT32 dy;
  OPJ_UINT32 x;
  OPJ_UINT32 yoff;
  OPJ_UINT32 xoff;
  OPJ_UINT32 y;
  OPJ_INT32 *l_dst;
  OPJ_INT32 *l_src;
  opj_image_comp_t *l_org_cmp_1;
  opj_image_comp_t *l_new_cmp_1;
  opj_image_comp_t *l_org_cmp;
  opj_image_cmptparm_t *l_new_cmp;
  OPJ_UINT32 compno;
  OPJ_BOOL l_upsample_need;
  opj_image_cmptparm_t *l_new_components;
  opj_image_t *l_new_image;
  opj_image_t *original_local;
  
  bVar1 = false;
  l_new_cmp._0_4_ = 0;
  do {
    if (original->numcomps <= (uint)l_new_cmp) {
LAB_0010615b:
      original_local = original;
      if (bVar1) {
        __ptr = malloc((ulong)original->numcomps * 0x24);
        if (__ptr == (void *)0x0) {
          fprintf(_stderr,
                  "ERROR -> opj_decompress: failed to allocate memory for upsampled components!\n");
          opj_image_destroy(original);
          original_local = (opj_image_t *)0x0;
        }
        else {
          for (l_new_cmp._0_4_ = 0; (uint)l_new_cmp < original->numcomps;
              l_new_cmp._0_4_ = (uint)l_new_cmp + 1) {
            puVar4 = (undefined4 *)((long)__ptr + (ulong)(uint)l_new_cmp * 0x24);
            poVar5 = original->comps + (uint)l_new_cmp;
            puVar4[7] = poVar5->bpp;
            puVar4[6] = poVar5->prec;
            puVar4[8] = poVar5->sgnd;
            puVar4[4] = original->x0;
            puVar4[5] = original->y0;
            *puVar4 = 1;
            puVar4[1] = 1;
            puVar4[2] = poVar5->w;
            puVar4[3] = poVar5->h;
            if (1 < poVar5->dx) {
              puVar4[2] = original->x1 - original->x0;
            }
            if (1 < poVar5->dy) {
              puVar4[3] = original->y1 - original->y0;
            }
          }
          original_local =
               (opj_image_t *)opj_image_create(original->numcomps,__ptr,original->color_space);
          free(__ptr);
          if (original_local == (opj_image_t *)0x0) {
            fprintf(_stderr,
                    "ERROR -> opj_decompress: failed to allocate memory for upsampled components!\n"
                   );
            opj_image_destroy(original);
            original_local = (opj_image_t *)0x0;
          }
          else {
            original_local->x0 = original->x0;
            original_local->x1 = original->x1;
            original_local->y0 = original->y0;
            original_local->y1 = original->y1;
            for (l_new_cmp._0_4_ = 0; (uint)l_new_cmp < original->numcomps;
                l_new_cmp._0_4_ = (uint)l_new_cmp + 1) {
              poVar5 = original_local->comps;
              poVar6 = original->comps + (uint)l_new_cmp;
              poVar5[(uint)l_new_cmp].factor = poVar6->factor;
              poVar5[(uint)l_new_cmp].alpha = poVar6->alpha;
              poVar5[(uint)l_new_cmp].resno_decoded = poVar6->resno_decoded;
              if ((poVar6->dx < 2) && (poVar6->dy < 2)) {
                memcpy(poVar5[(uint)l_new_cmp].data,poVar6->data,
                       (ulong)poVar6->w * 4 * (ulong)poVar6->h);
              }
              else {
                l_dst = poVar6->data;
                _xoff = poVar5[(uint)l_new_cmp].data;
                uVar2 = poVar6->dx * poVar6->x0 - original->x0;
                uVar3 = poVar6->dy * poVar6->y0 - original->y0;
                if ((poVar6->dx <= uVar2) || (poVar6->dy <= uVar3)) {
                  fprintf(_stderr,
                          "ERROR -> opj_decompress: Invalid image/component parameters found when upsampling\n"
                         );
                  opj_image_destroy(original);
                  opj_image_destroy(original_local);
                  return (opj_image_t *)0x0;
                }
                for (yoff = 0; yoff < uVar3; yoff = yoff + 1) {
                  memset(_xoff,0,(ulong)poVar5[(uint)l_new_cmp].w << 2);
                  _xoff = _xoff + poVar5[(uint)l_new_cmp].w;
                }
                if (poVar6->dy - 1 < poVar5[(uint)l_new_cmp].h) {
                  for (; yoff < poVar5[(uint)l_new_cmp].h - (poVar6->dy - 1);
                      yoff = poVar6->dy + yoff) {
                    x_1 = 0;
                    for (xorg = 0; xorg < uVar2; xorg = xorg + 1) {
                      _xoff[xorg] = 0;
                    }
                    if (poVar6->dx - 1 < poVar5[(uint)l_new_cmp].w) {
                      for (; xorg < poVar5[(uint)l_new_cmp].w - (poVar6->dx - 1);
                          xorg = poVar6->dx + xorg) {
                        for (xorg_1 = 0; xorg_1 < poVar6->dx; xorg_1 = xorg_1 + 1) {
                          _xoff[xorg + xorg_1] = l_dst[x_1];
                        }
                        x_1 = x_1 + 1;
                      }
                    }
                    for (; xorg < poVar5[(uint)l_new_cmp].w; xorg = xorg + 1) {
                      _xoff[xorg] = l_dst[x_1];
                    }
                    _xoff = _xoff + poVar5[(uint)l_new_cmp].w;
                    for (dx = 1; dx < poVar6->dy; dx = dx + 1) {
                      memcpy(_xoff,_xoff + -(ulong)poVar5[(uint)l_new_cmp].w,
                             (ulong)poVar5[(uint)l_new_cmp].w << 2);
                      _xoff = _xoff + poVar5[(uint)l_new_cmp].w;
                    }
                    l_dst = l_dst + poVar6->w;
                  }
                }
                if (yoff < poVar5[(uint)l_new_cmp].h) {
                  local_84 = 0;
                  for (dx_1 = 0; dx_1 < uVar2; dx_1 = dx_1 + 1) {
                    _xoff[dx_1] = 0;
                  }
                  if (poVar6->dx - 1 < poVar5[(uint)l_new_cmp].w) {
                    for (; dx_1 < poVar5[(uint)l_new_cmp].w - (poVar6->dx - 1);
                        dx_1 = poVar6->dx + dx_1) {
                      for (local_88 = 0; local_88 < poVar6->dx; local_88 = local_88 + 1) {
                        _xoff[dx_1 + local_88] = l_dst[local_84];
                      }
                      local_84 = local_84 + 1;
                    }
                  }
                  for (; dx_1 < poVar5[(uint)l_new_cmp].w; dx_1 = dx_1 + 1) {
                    _xoff[dx_1] = l_dst[local_84];
                  }
                  _xoff = _xoff + poVar5[(uint)l_new_cmp].w;
                  while (yoff = yoff + 1, yoff < poVar5[(uint)l_new_cmp].h) {
                    memcpy(_xoff,_xoff + -(ulong)poVar5[(uint)l_new_cmp].w,
                           (ulong)poVar5[(uint)l_new_cmp].w << 2);
                    _xoff = _xoff + poVar5[(uint)l_new_cmp].w;
                  }
                }
              }
            }
            opj_image_destroy(original);
          }
        }
      }
      return original_local;
    }
    if (original->comps[(uint)l_new_cmp].factor != 0) {
      fprintf(_stderr,"ERROR -> opj_decompress: -upsample not supported with reduction\n");
      opj_image_destroy(original);
      return (opj_image_t *)0x0;
    }
    if ((1 < original->comps[(uint)l_new_cmp].dx) || (1 < original->comps[(uint)l_new_cmp].dy)) {
      bVar1 = true;
      goto LAB_0010615b;
    }
    l_new_cmp._0_4_ = (uint)l_new_cmp + 1;
  } while( true );
}

Assistant:

static opj_image_t* upsample_image_components(opj_image_t* original)
{
    opj_image_t* l_new_image = NULL;
    opj_image_cmptparm_t* l_new_components = NULL;
    OPJ_BOOL l_upsample_need = OPJ_FALSE;
    OPJ_UINT32 compno;

    for (compno = 0U; compno < original->numcomps; ++compno) {
        if (original->comps[compno].factor > 0U) {
            fprintf(stderr,
                    "ERROR -> opj_decompress: -upsample not supported with reduction\n");
            opj_image_destroy(original);
            return NULL;
        }
        if ((original->comps[compno].dx > 1U) || (original->comps[compno].dy > 1U)) {
            l_upsample_need = OPJ_TRUE;
            break;
        }
    }
    if (!l_upsample_need) {
        return original;
    }
    /* Upsample is needed */
    l_new_components = (opj_image_cmptparm_t*)malloc(original->numcomps * sizeof(
                           opj_image_cmptparm_t));
    if (l_new_components == NULL) {
        fprintf(stderr,
                "ERROR -> opj_decompress: failed to allocate memory for upsampled components!\n");
        opj_image_destroy(original);
        return NULL;
    }

    for (compno = 0U; compno < original->numcomps; ++compno) {
        opj_image_cmptparm_t* l_new_cmp = &(l_new_components[compno]);
        opj_image_comp_t*     l_org_cmp = &(original->comps[compno]);

        l_new_cmp->bpp  = l_org_cmp->bpp;
        l_new_cmp->prec = l_org_cmp->prec;
        l_new_cmp->sgnd = l_org_cmp->sgnd;
        l_new_cmp->x0   = original->x0;
        l_new_cmp->y0   = original->y0;
        l_new_cmp->dx   = 1;
        l_new_cmp->dy   = 1;
        l_new_cmp->w    =
            l_org_cmp->w; /* should be original->x1 - original->x0 for dx==1 */
        l_new_cmp->h    =
            l_org_cmp->h; /* should be original->y1 - original->y0 for dy==0 */

        if (l_org_cmp->dx > 1U) {
            l_new_cmp->w = original->x1 - original->x0;
        }

        if (l_org_cmp->dy > 1U) {
            l_new_cmp->h = original->y1 - original->y0;
        }
    }

    l_new_image = opj_image_create(original->numcomps, l_new_components,
                                   original->color_space);
    free(l_new_components);
    if (l_new_image == NULL) {
        fprintf(stderr,
                "ERROR -> opj_decompress: failed to allocate memory for upsampled components!\n");
        opj_image_destroy(original);
        return NULL;
    }

    l_new_image->x0 = original->x0;
    l_new_image->x1 = original->x1;
    l_new_image->y0 = original->y0;
    l_new_image->y1 = original->y1;

    for (compno = 0U; compno < original->numcomps; ++compno) {
        opj_image_comp_t* l_new_cmp = &(l_new_image->comps[compno]);
        opj_image_comp_t* l_org_cmp = &(original->comps[compno]);

        l_new_cmp->factor        = l_org_cmp->factor;
        l_new_cmp->alpha         = l_org_cmp->alpha;
        l_new_cmp->resno_decoded = l_org_cmp->resno_decoded;

        if ((l_org_cmp->dx > 1U) || (l_org_cmp->dy > 1U)) {
            const OPJ_INT32* l_src = l_org_cmp->data;
            OPJ_INT32*       l_dst = l_new_cmp->data;
            OPJ_UINT32 y;
            OPJ_UINT32 xoff, yoff;

            /* need to take into account dx & dy */
            xoff = l_org_cmp->dx * l_org_cmp->x0 -  original->x0;
            yoff = l_org_cmp->dy * l_org_cmp->y0 -  original->y0;
            if ((xoff >= l_org_cmp->dx) || (yoff >= l_org_cmp->dy)) {
                fprintf(stderr,
                        "ERROR -> opj_decompress: Invalid image/component parameters found when upsampling\n");
                opj_image_destroy(original);
                opj_image_destroy(l_new_image);
                return NULL;
            }

            for (y = 0U; y < yoff; ++y) {
                memset(l_dst, 0U, l_new_cmp->w * sizeof(OPJ_INT32));
                l_dst += l_new_cmp->w;
            }

            if (l_new_cmp->h > (l_org_cmp->dy -
                                1U)) { /* check subtraction overflow for really small images */
                for (; y < l_new_cmp->h - (l_org_cmp->dy - 1U); y += l_org_cmp->dy) {
                    OPJ_UINT32 x, dy;
                    OPJ_UINT32 xorg;

                    xorg = 0U;
                    for (x = 0U; x < xoff; ++x) {
                        l_dst[x] = 0;
                    }
                    if (l_new_cmp->w > (l_org_cmp->dx -
                                        1U)) { /* check subtraction overflow for really small images */
                        for (; x < l_new_cmp->w - (l_org_cmp->dx - 1U); x += l_org_cmp->dx, ++xorg) {
                            OPJ_UINT32 dx;
                            for (dx = 0U; dx < l_org_cmp->dx; ++dx) {
                                l_dst[x + dx] = l_src[xorg];
                            }
                        }
                    }
                    for (; x < l_new_cmp->w; ++x) {
                        l_dst[x] = l_src[xorg];
                    }
                    l_dst += l_new_cmp->w;

                    for (dy = 1U; dy < l_org_cmp->dy; ++dy) {
                        memcpy(l_dst, l_dst - l_new_cmp->w, l_new_cmp->w * sizeof(OPJ_INT32));
                        l_dst += l_new_cmp->w;
                    }
                    l_src += l_org_cmp->w;
                }
            }
            if (y < l_new_cmp->h) {
                OPJ_UINT32 x;
                OPJ_UINT32 xorg;

                xorg = 0U;
                for (x = 0U; x < xoff; ++x) {
                    l_dst[x] = 0;
                }
                if (l_new_cmp->w > (l_org_cmp->dx -
                                    1U)) { /* check subtraction overflow for really small images */
                    for (; x < l_new_cmp->w - (l_org_cmp->dx - 1U); x += l_org_cmp->dx, ++xorg) {
                        OPJ_UINT32 dx;
                        for (dx = 0U; dx < l_org_cmp->dx; ++dx) {
                            l_dst[x + dx] = l_src[xorg];
                        }
                    }
                }
                for (; x < l_new_cmp->w; ++x) {
                    l_dst[x] = l_src[xorg];
                }
                l_dst += l_new_cmp->w;
                ++y;
                for (; y < l_new_cmp->h; ++y) {
                    memcpy(l_dst, l_dst - l_new_cmp->w, l_new_cmp->w * sizeof(OPJ_INT32));
                    l_dst += l_new_cmp->w;
                }
            }
        } else {
            memcpy(l_new_cmp->data, l_org_cmp->data,
                   sizeof(OPJ_INT32) * l_org_cmp->w * l_org_cmp->h);
        }
    }
    opj_image_destroy(original);
    return l_new_image;
}